

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall
ktx::CommandExtract::OptionsExtract::process
          (OptionsExtract *this,Options *param_1,ParseResult *args,Reporter *report)

{
  pointer pHVar1;
  RangeIndex *pRVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  HalfRange *range;
  size_t sVar6;
  OptionValue *pOVar7;
  bool *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer pHVar10;
  undefined8 uVar11;
  bool *found;
  string_view str;
  optional<ktx::SelectorRange> level;
  optional<ktx::SelectorRange> depth_;
  optional<ktx::SelectorRange> face;
  optional<ktx::SelectorRange> layer;
  anon_class_16_2_501fead0 parseSelector;
  string local_148;
  undefined1 local_128 [32];
  pointer pHStack_108;
  pointer local_100;
  pointer local_f8;
  pointer pHStack_f0;
  pointer local_e8;
  allocator<char> local_d1;
  _Storage<ktx::SelectorRange,_false> local_d0;
  char local_b8;
  _Storage<ktx::SelectorRange,_false> local_b0;
  char local_98;
  _Storage<ktx::SelectorRange,_false> local_90;
  char local_78;
  _Storage<ktx::SelectorRange,_false> local_70;
  char local_58;
  anon_class_16_2_501fead0 local_50;
  bool *local_40;
  bool *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kOutput,(allocator<char> *)&local_d0._M_value);
  sVar6 = cxxopts::ParseResult::count(args,(string *)local_128);
  pHVar10 = (pointer)(local_128 + 0x10);
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if (sVar6 == 0) {
    Reporter::fatal_usage<char_const(&)[39]>
              (report,(char (*) [39])"Missing output file or directory path.");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,kOutput,(allocator<char> *)&local_d0._M_value);
    pOVar7 = cxxopts::ParseResult::operator[](args,(string *)local_128);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
    std::__cxx11::string::_M_assign((string *)this);
    if ((pointer)local_128._0_8_ != pHVar10) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    }
  }
  local_50.args = args;
  local_50.report = report;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kLevel,(allocator<char> *)&local_70._M_value);
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_d0._M_value,&local_50,(string *)local_128,
             &this->levelFlagUsed);
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kLayer,(allocator<char> *)&local_90._M_value);
  local_38 = &this->layerFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_70._M_value,&local_50,(string *)local_128,
             local_38);
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kFace,(allocator<char> *)&local_b0._M_value);
  local_40 = &this->faceFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_90._M_value,&local_50,(string *)local_128,
             local_40);
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kDepth,(allocator<char> *)&local_148);
  found = &this->depthFlagUsed;
  process::anon_class_16_2_501fead0::operator()
            ((optional<ktx::SelectorRange> *)&local_b0._M_value,&local_50,(string *)local_128,found)
  ;
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kRaw,(allocator<char> *)&local_148);
  pOVar7 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  pbVar8 = cxxopts::OptionValue::as<bool>(pOVar7);
  this->raw = *pbVar8;
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kAll,(allocator<char> *)&local_148);
  pOVar7 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  pbVar8 = cxxopts::OptionValue::as<bool>(pOVar7);
  bVar3 = *pbVar8;
  this->globalAll = (bool)bVar3;
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
    bVar3 = this->globalAll;
  }
  if ((bVar3 & 1) != 0) {
    if (local_b8 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --level cannot be used with --all.");
    }
    if (local_58 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --layer cannot be used with --all.");
    }
    if (local_78 == '\x01') {
      Reporter::fatal_usage<char_const(&)[55]>
                (report,(char (*) [55])"Conflicting options: --face cannot be used with --all.");
    }
    if (local_98 == '\x01') {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --depth cannot be used with --all.");
    }
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_d0._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_70._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_90._M_value,(All_t *)&all);
    std::optional<ktx::SelectorRange>::operator=
              ((optional<ktx::SelectorRange> *)&local_b0._M_value,(All_t *)&all);
    bVar3 = this->globalAll;
  }
  if (((bVar3 & 1) != 0) && (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
    Reporter::fatal_usage<char_const(&)[57]>
              (report,(char (*) [57])"stdout cannot be used with multi-output \'--all\' extract.");
  }
  if (((local_b8 == '\x01') && (bVar4 = operator==(&local_d0), bVar4)) &&
     (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--level all\' extract.");
  }
  if (((local_58 == '\x01') && (bVar4 = operator==(&local_70), bVar4)) &&
     (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--layer all\' extract.");
  }
  if (((local_78 == '\x01') && (bVar4 = operator==(&local_90), bVar4)) &&
     (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
    Reporter::fatal_usage<char_const(&)[62]>
              (report,(char (*) [62])
                      "stdout cannot be used with multi-output \'--face all\' extract.");
  }
  if (((local_98 == '\x01') && (bVar4 = operator==(&local_b0), bVar4)) &&
     (iVar5 = std::__cxx11::string::compare((char *)this), iVar5 == 0)) {
    Reporter::fatal_usage<char_const(&)[63]>
              (report,(char (*) [63])
                      "stdout cannot be used with multi-output \'--depth all\' extract.");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,kUri,(allocator<char> *)&local_148);
  pOVar7 = cxxopts::ParseResult::operator[](args,(string *)local_128);
  sVar6 = pOVar7->m_count;
  if ((pointer)local_128._0_8_ != pHVar10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  if (sVar6 == 0) {
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    uVar11 = local_148.field_2._M_allocated_capacity;
    if (local_b8 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_d0._M_value.ranges);
      uVar11 = local_128._16_8_;
    }
    else {
      local_128._0_4_ = local_148._M_dataplus._M_p._0_4_;
      local_128._4_4_ = local_148._M_dataplus._M_p._4_4_;
      local_128._8_4_ = (undefined4)local_148._M_string_length;
      local_128._12_4_ = local_148._M_string_length._4_4_;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    pHVar10 = (this->fragmentURI).mip.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     &(this->fragmentURI).mip.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start = local_128._0_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_128._4_4_;
    *(undefined4 *)
     &(this->fragmentURI).mip.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_128._8_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_128._12_4_;
    (this->fragmentURI).mip.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar11;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if ((pHVar10 != (pointer)0x0) &&
       (operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10),
       (pointer)local_128._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    uVar11 = local_148.field_2._M_allocated_capacity;
    if (local_58 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_70._M_value.ranges);
      uVar11 = local_128._16_8_;
    }
    else {
      local_128._0_4_ = local_148._M_dataplus._M_p._0_4_;
      local_128._4_4_ = local_148._M_dataplus._M_p._4_4_;
      local_128._8_4_ = (undefined4)local_148._M_string_length;
      local_128._12_4_ = local_148._M_string_length._4_4_;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    pHVar10 = (this->fragmentURI).stratal.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).stratal.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     &(this->fragmentURI).stratal.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start = local_128._0_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).stratal.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_128._4_4_;
    *(undefined4 *)
     &(this->fragmentURI).stratal.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_128._8_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).stratal.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_128._12_4_;
    (this->fragmentURI).stratal.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar11;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if ((pHVar10 != (pointer)0x0) &&
       (operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10),
       (pointer)local_128._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
    SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
    uVar11 = local_148.field_2._M_allocated_capacity;
    if (local_78 == '\x01') {
      std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
      vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)local_128,&local_90._M_value.ranges);
      uVar11 = local_128._16_8_;
    }
    else {
      local_128._0_4_ = local_148._M_dataplus._M_p._0_4_;
      local_128._4_4_ = local_148._M_dataplus._M_p._4_4_;
      local_128._8_4_ = (undefined4)local_148._M_string_length;
      local_128._12_4_ = local_148._M_string_length._4_4_;
      local_148._M_dataplus._M_p = (pointer)0x0;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity = 0;
    }
    pHVar10 = (this->fragmentURI).facial.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).facial.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined4 *)
     &(this->fragmentURI).facial.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_start = local_128._0_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).facial.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = local_128._4_4_;
    *(undefined4 *)
     &(this->fragmentURI).facial.ranges.
      super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_128._8_4_;
    *(undefined4 *)
     ((long)&(this->fragmentURI).facial.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_128._12_4_;
    (this->fragmentURI).facial.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar11;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if ((pHVar10 != (pointer)0x0) &&
       (operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10),
       (pointer)local_128._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if (local_148._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_148._M_dataplus._M_p,
                      local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
    }
  }
  else {
    this->uriFlagUsed = true;
    if (this->globalAll == true) {
      Reporter::fatal_usage<char_const(&)[54]>
                (report,(char (*) [54])"Conflicting options: --all cannot be used with --uri.");
    }
    if (this->levelFlagUsed == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --level cannot be used with --uri.");
    }
    if (*local_38 == true) {
      Reporter::fatal_usage<char_const(&)[56]>
                (report,(char (*) [56])"Conflicting options: --layer cannot be used with --uri.");
    }
    if (*local_40 == true) {
      Reporter::fatal_usage<char_const(&)[55]>
                (report,(char (*) [55])"Conflicting options: --face cannot be used with --uri.");
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,kUri,&local_d1);
    pOVar7 = cxxopts::ParseResult::operator[](args,&local_148);
    pbVar9 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
    str._M_str = found;
    str._M_len = (size_t)(pbVar9->_M_dataplus)._M_p;
    parseFragmentURI((FragmentURI *)local_128,(ktx *)pbVar9->_M_string_length,str);
    pHVar10 = (this->fragmentURI).mip.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->fragmentURI).mip.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._0_8_;
    (this->fragmentURI).mip.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_128._8_8_;
    (this->fragmentURI).mip.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_128._16_8_;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    if (pHVar10 != (pointer)0x0) {
      operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10);
    }
    pHVar10 = (this->fragmentURI).stratal.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).stratal.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->fragmentURI).stratal.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_128._24_8_;
    (this->fragmentURI).stratal.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHStack_108;
    (this->fragmentURI).stratal.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_100;
    local_128._24_8_ = (pointer)0x0;
    pHStack_108 = (pointer)0x0;
    local_100 = (pointer)0x0;
    if (pHVar10 != (pointer)0x0) {
      operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10);
    }
    pHVar10 = (this->fragmentURI).facial.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).facial.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->fragmentURI).facial.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_start = local_f8;
    (this->fragmentURI).facial.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = pHStack_f0;
    (this->fragmentURI).facial.ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_e8;
    local_f8 = (pointer)0x0;
    pHStack_f0 = (pointer)0x0;
    local_e8 = (pointer)0x0;
    if ((pHVar10 != (pointer)0x0) &&
       (operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10), local_f8 != (pointer)0x0)) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
    if ((pointer)local_128._24_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._24_8_,(long)local_100 - local_128._24_8_);
    }
    if ((pointer)local_128._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    pHVar10 = (this->fragmentURI).mip.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).mip.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar10 != pHVar1) {
      pRVar2 = &pHVar10->begin;
      do {
        if ((pHVar10->begin != *pRVar2) || (pHVar10->end != *pRVar2 + 1)) goto LAB_0018bbcf;
        pHVar10 = pHVar10 + 1;
      } while (pHVar10 != pHVar1);
    }
    pHVar10 = (this->fragmentURI).stratal.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).stratal.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar10 != pHVar1) {
      pRVar2 = &pHVar10->begin;
      do {
        if ((pHVar10->begin != *pRVar2) || (pHVar10->end != *pRVar2 + 1)) goto LAB_0018bbcf;
        pHVar10 = pHVar10 + 1;
      } while (pHVar10 != pHVar1);
    }
    pHVar10 = (this->fragmentURI).facial.ranges.
              super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pHVar1 = (this->fragmentURI).facial.ranges.
             super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pHVar10 != pHVar1) {
      pRVar2 = &pHVar10->begin;
      do {
        if ((pHVar10->begin != *pRVar2) || (pHVar10->end != *pRVar2 + 1)) goto LAB_0018bbcf;
        pHVar10 = pHVar10 + 1;
      } while (pHVar10 != pHVar1);
    }
  }
LAB_0018bdf8:
  SelectorRange::SelectorRange((SelectorRange *)&local_148,0,1);
  uVar11 = local_148.field_2._M_allocated_capacity;
  if (local_98 == '\x01') {
    std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
    vector((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_> *)
           local_128,&local_b0._M_value.ranges);
    uVar11 = local_128._16_8_;
  }
  else {
    local_128._0_4_ = local_148._M_dataplus._M_p._0_4_;
    local_128._4_4_ = local_148._M_dataplus._M_p._4_4_;
    local_128._8_4_ = (undefined4)local_148._M_string_length;
    local_128._12_4_ = local_148._M_string_length._4_4_;
    local_148._M_dataplus._M_p = (pointer)0x0;
    local_148._M_string_length = 0;
    local_148.field_2._M_allocated_capacity = 0;
  }
  pHVar10 = (this->depth).ranges.
            super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pHVar1 = (this->depth).ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined4 *)
   &(this->depth).ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_start = local_128._0_4_;
  *(undefined4 *)
   ((long)&(this->depth).ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = local_128._4_4_;
  *(undefined4 *)
   &(this->depth).ranges.
    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_128._8_4_;
  *(undefined4 *)
   ((long)&(this->depth).ranges.
           super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = local_128._12_4_;
  (this->depth).ranges.
  super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar11;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = 0;
  if ((pHVar10 != (pointer)0x0) &&
     (operator_delete(pHVar10,(long)pHVar1 - (long)pHVar10),
     (pointer)local_128._0_8_ != (pointer)0x0)) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  if (local_148._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_148._M_dataplus._M_p,
                    local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
  }
  if ((local_98 == '\x01') &&
     (local_98 = '\0',
     local_b0._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_b0._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_b0._0_8_);
  }
  if ((local_78 == '\x01') &&
     (local_78 = '\0',
     local_90._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_90._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_90._0_8_);
  }
  if ((local_58 == '\x01') &&
     (local_58 = '\0',
     local_70._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_70._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_70._0_8_);
  }
  if ((local_b8 == '\x01') &&
     (local_b8 = 0,
     local_d0._M_value.ranges.
     super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_d0._M_value.ranges.
                    super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0._M_value.ranges.
                          super__Vector_base<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - local_d0._0_8_);
  }
  return;
LAB_0018bbcf:
  iVar5 = std::__cxx11::string::compare((char *)this);
  if (iVar5 == 0) {
    Reporter::fatal_usage<char_const(&)[57]>
              (report,(char (*) [57])"stdout cannot be used with multi-output \'--uri\' extract.");
  }
  goto LAB_0018bdf8;
}

Assistant:

void CommandExtract::OptionsExtract::process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
    if (args.count(kOutput))
        outputPath = args[kOutput].as<std::string>();
    else
        report.fatal_usage("Missing output file or directory path.");

    const auto parseSelector = [&](const std::string& name, bool& found) -> std::optional<SelectorRange> {
        if (!args[name].count())
            return std::nullopt;
        const auto str = to_lower_copy(args[name].as<std::string>());
        try {
            found = true;
            return str == kAll ? SelectorRange(all) : SelectorRange(std::stoi(str));
        } catch (const std::invalid_argument&) {
            report.fatal_usage("Invalid {} value \"{}\". The value must be a either a number or \"all\".", name, str);
        } catch (const std::out_of_range& e) {
            report.fatal_usage("Out of range {} value \"{}\": {}.", name, str, e.what());
        }
        return std::nullopt;
    };

    auto level = parseSelector(kLevel, levelFlagUsed);
    auto layer = parseSelector(kLayer, layerFlagUsed);
    auto face = parseSelector(kFace, faceFlagUsed);
    auto depth_ = parseSelector(kDepth, depthFlagUsed);
    raw = args[kRaw].as<bool>();
    globalAll = args[kAll].as<bool>();

    if (globalAll) {
        if (level)
            report.fatal_usage("Conflicting options: --level cannot be used with --all.");
        if (layer)
            report.fatal_usage("Conflicting options: --layer cannot be used with --all.");
        if (face)
            report.fatal_usage("Conflicting options: --face cannot be used with --all.");
        if (depth_)
            report.fatal_usage("Conflicting options: --depth cannot be used with --all.");

        level = all;
        layer = all;
        face = all;
        depth_ = all;
    }

    if (globalAll && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--all' extract.");
    if (level == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--level all' extract.");
    if (layer == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--layer all' extract.");
    if (face == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--face all' extract.");
    if (depth_ == all && outputPath == "-")
        report.fatal_usage("stdout cannot be used with multi-output '--depth all' extract.");

    if (args[kUri].count()) {
        uriFlagUsed = true;

        if (globalAll)
            report.fatal_usage("Conflicting options: --all cannot be used with --uri.");
        if (levelFlagUsed)
            report.fatal_usage("Conflicting options: --level cannot be used with --uri.");
        if (layerFlagUsed)
            report.fatal_usage("Conflicting options: --layer cannot be used with --uri.");
        if (faceFlagUsed)
            report.fatal_usage("Conflicting options: --face cannot be used with --uri.");

        try {
            fragmentURI = parseFragmentURI(args[kUri].as<std::string>());
        } catch (const std::exception& e) {
            report.fatal_usage("Failed to parse Fragment URI: {}", e.what());
        }

        const auto isMultiOutputFragmentURI =
                (!fragmentURI.mip.is_undefined() && fragmentURI.mip.is_multi()) ||
                (!fragmentURI.stratal.is_undefined() && fragmentURI.stratal.is_multi()) ||
                (!fragmentURI.facial.is_undefined() && fragmentURI.facial.is_multi());
        if (isMultiOutputFragmentURI && outputPath == "-")
            report.fatal_usage("stdout cannot be used with multi-output '--uri' extract.");

    } else {
        // Merge every other selection method into the fragmentURI
        fragmentURI.mip = level.value_or(SelectorRange(0));
        fragmentURI.stratal = layer.value_or(SelectorRange(0));
        fragmentURI.facial = face.value_or(SelectorRange(0));
    }

    this->depth = depth_.value_or(SelectorRange(0));
}